

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_contains(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  uint uVar8;
  ushort uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  
  iVar5 = (r->high_low_container).size;
  if ((long)iVar5 == 0) {
LAB_0011c765:
    uVar8 = iVar5 - 1;
  }
  else {
    puVar3 = (r->high_low_container).keys;
    uVar9 = (ushort)(val >> 0x10);
    if (puVar3[(long)iVar5 + -1] == uVar9) goto LAB_0011c765;
    uVar6 = 0;
    if (iVar5 < 1) goto LAB_0011c8b9;
    iVar5 = iVar5 + -1;
    do {
      uVar8 = iVar5 + uVar6 >> 1;
      uVar2 = *(ushort *)((long)puVar3 + (ulong)(iVar5 + uVar6 & 0xfffffffe));
      if (uVar2 < uVar9) {
        uVar6 = uVar8 + 1;
      }
      else {
        if (uVar2 <= uVar9) goto LAB_0011c76f;
        iVar5 = uVar8 - 1;
      }
    } while ((int)uVar6 <= iVar5);
    uVar8 = ~uVar6;
  }
  if (-1 < (int)uVar8) {
LAB_0011c76f:
    uVar1 = (r->high_low_container).typecodes[(ulong)uVar8 & 0xffff];
    puVar7 = (uint *)(r->high_low_container).containers[(ulong)uVar8 & 0xffff];
    if (uVar1 == '\x04') {
      uVar1 = (uint8_t)puVar7[2];
      if (uVar1 == '\x04') {
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      puVar7 = *(uint **)puVar7;
    }
    uVar9 = (ushort)val;
    if (uVar1 != '\x03') {
      if (uVar1 == '\x02') {
        uVar8 = 0;
        uVar11 = *puVar7;
        do {
          iVar5 = uVar8 + 0x10;
          while( true ) {
            if ((int)uVar11 <= iVar5) {
              if ((int)uVar11 <= (int)uVar8) goto LAB_0011c8b7;
              uVar10 = (ulong)uVar8;
              goto LAB_0011c89c;
            }
            uVar6 = (uVar11 - 1) + uVar8;
            uVar12 = uVar6 >> 1;
            uVar2 = *(ushort *)(*(long *)(puVar7 + 2) + (ulong)(uVar6 & 0xfffffffe));
            if (uVar9 <= uVar2) break;
            uVar8 = uVar12 + 1;
            iVar5 = uVar12 + 0x11;
          }
          uVar6 = 1;
          uVar11 = uVar12;
        } while (uVar9 < uVar2);
      }
      else {
        if (uVar1 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x124d,"_Bool container_contains(const container_t *, uint16_t, uint8_t)");
        }
        uVar6 = (uint)((*(ulong *)(*(long *)(puVar7 + 2) + (ulong)(val >> 3 & 0x1ff8)) >>
                        ((ulong)val & 0x3f) & 1) != 0);
      }
      goto LAB_0011c8b9;
    }
    if (0 < (int)*puVar7) {
      lVar4 = *(long *)(puVar7 + 2);
      iVar5 = *puVar7 - 1;
      uVar8 = 0;
      do {
        uVar6 = iVar5 + uVar8 >> 1;
        uVar2 = *(ushort *)(lVar4 + (ulong)uVar6 * 4);
        if (uVar2 < uVar9) {
          uVar8 = uVar6 + 1;
        }
        else {
          if (uVar2 <= uVar9) {
            uVar6 = 1;
            goto LAB_0011c8b9;
          }
          iVar5 = uVar6 - 1;
        }
      } while ((int)uVar8 <= iVar5);
      if ((uVar8 != 0) &&
         (uVar6 = 1,
         (int)((val & 0xffff) - (uint)*(ushort *)(lVar4 + -4 + (ulong)uVar8 * 4)) <=
         (int)(uint)*(ushort *)(lVar4 + -2 + (ulong)uVar8 * 4))) goto LAB_0011c8b9;
    }
  }
LAB_0011c8b7:
  uVar6 = 0;
LAB_0011c8b9:
  return SUB41(uVar6,0);
  while (iVar5 = (int)uVar10, uVar10 = uVar10 + 1, uVar11 - 1 != iVar5) {
LAB_0011c89c:
    uVar2 = *(ushort *)(*(long *)(puVar7 + 2) + uVar10 * 2);
    bVar13 = uVar2 == uVar9;
    uVar6 = (uint)bVar13;
    if ((bVar13) || (uVar9 <= uVar2 && !bVar13)) break;
  }
  goto LAB_0011c8b9;
}

Assistant:

bool roaring_bitmap_contains(const roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    /*
     * the next function call involves a binary search and lots of branching.
     */
    int32_t i = ra_get_index(&r->high_low_container, hb);
    if (i < 0) return false;

    uint8_t typecode;
    // next call ought to be cheap
    container_t *container =
        ra_get_container_at_index(&r->high_low_container, i, &typecode);
    // rest might be a tad expensive, possibly involving another round of binary search
    return container_contains(container, val & 0xFFFF, typecode);
}